

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_7::Validator::BeginTryExpr(Validator *this,TryExpr *expr)

{
  Location *loc;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)46>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckBlockDeclaration(this,loc,(Opcode)0x6,&(expr->block).decl);
  TypeChecker::OnTry(&this->typechecker_,&(expr->block).decl.sig.param_types,
                     &(expr->block).decl.sig.result_types);
  return (Result)Ok;
}

Assistant:

Result Validator::BeginTryExpr(TryExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::Try, &expr->block.decl);
  typechecker_.OnTry(expr->block.decl.sig.param_types,
                     expr->block.decl.sig.result_types);
  return Result::Ok;
}